

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOVD(uchar *stream,x86Reg dst,x86XmmReg src)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86XmmReg src_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  *stream = 'f';
  uVar2 = encodeRex(stream + 1,false,src,dst);
  puVar3 = stream + 1 + uVar2;
  *puVar3 = '\x0f';
  puVar3[1] = '~';
  uVar1 = encodeRegister(dst,src);
  puVar3[2] = uVar1;
  return ((int)puVar3 + 3) - (int)stream;
}

Assistant:

int x86MOVD(unsigned char *stream, x86Reg dst, x86XmmReg src)
{
	unsigned char *start = stream;

	*stream++ = 0x66;
	stream += encodeRex(stream, false, src, dst);
	*stream++ = 0x0f;
	*stream++ = 0x7e;
	*stream++ = encodeRegister(dst, src);

	return int(stream - start);
}